

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  ulong uVar1;
  u64 n;
  byte bVar2;
  sqlite3_vfs *psVar3;
  char **ppcVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  void *pvVar10;
  _func_void *p_Var11;
  byte *pbVar12;
  void **__s;
  uint uVar13;
  long lVar14;
  uint uVar15;
  char *local_60;
  char **local_58;
  char *local_50;
  ulong local_48;
  ulong local_40;
  char *local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar3 = db->pVfs;
  local_60 = (char *)0x0;
  if (zFile == (char *)0x0) {
    uVar8 = 0;
  }
  else {
    sVar7 = strlen(zFile);
    uVar8 = (ulong)((uint)sVar7 & 0x3fffffff);
  }
  if (pzErrMsg != (char **)0x0) {
    *pzErrMsg = (char *)0x0;
  }
  if ((db->flags & 0x10000) == 0) {
    uVar15 = 1;
    if (pzErrMsg != (char **)0x0) {
      pcVar9 = sqlite3_mprintf("not authorized");
      *pzErrMsg = pcVar9;
    }
    goto LAB_0011dd48;
  }
  local_48 = (ulong)((int)uVar8 + 300);
  local_50 = "sqlite3_extension_init";
  if (zProc != (char *)0x0) {
    local_50 = zProc;
  }
  local_58 = pzErrMsg;
  local_40 = uVar8;
  local_38 = zProc;
  pvVar10 = (*psVar3->xDlOpen)(psVar3,zFile);
  bVar5 = true;
  do {
    ppcVar4 = local_58;
    if ((!bVar5) || (pvVar10 != (void *)0x0)) {
      if (pvVar10 == (void *)0x0) {
        uVar15 = 1;
        if (local_58 != (char **)0x0) {
          iVar6 = sqlite3_initialize();
          if (iVar6 == 0) {
            local_60 = (char *)sqlite3Malloc(local_48);
          }
          else {
            local_60 = (char *)0x0;
          }
          *ppcVar4 = local_60;
          uVar15 = 1;
          if (local_60 != (char *)0x0) {
            sqlite3_snprintf((int)local_48,local_60,"unable to open shared library [%s]",zFile);
            (*psVar3->xDlError)(psVar3,(int)local_40 + 299,local_60);
          }
        }
        goto LAB_0011dd48;
      }
      p_Var11 = (*psVar3->xDlSym)(psVar3,pvVar10,local_50);
      uVar15 = 0;
      local_38 = (char *)((ulong)local_38 | (ulong)p_Var11);
      if (local_38 != (char *)0x0) {
        pcVar9 = (char *)0x0;
        goto LAB_0011dedf;
      }
      if (zFile != (char *)0x0) {
        sVar7 = strlen(zFile);
        uVar15 = (uint)sVar7 & 0x3fffffff;
      }
      iVar6 = sqlite3_initialize();
      if (iVar6 == 0) {
        pcVar9 = (char *)sqlite3Malloc((ulong)(uVar15 + 0x1e));
      }
      else {
        pcVar9 = (char *)0x0;
      }
      if (pcVar9 == (char *)0x0) {
        (*psVar3->xDlClose)(psVar3,pvVar10);
        p_Var11 = (_func_void *)0x0;
        goto LAB_0011ded6;
      }
      builtin_strncpy(pcVar9,"sqlite3_",8);
      uVar8 = (ulong)uVar15;
      goto LAB_0011de1d;
    }
    pcVar9 = sqlite3_mprintf("%s.%s",zFile,"so");
    if (pcVar9 == (char *)0x0) {
      pvVar10 = (void *)0x0;
    }
    else {
      pvVar10 = (*psVar3->xDlOpen)(psVar3,pcVar9);
      sqlite3_free(pcVar9);
    }
    bVar5 = false;
  } while (pcVar9 != (char *)0x0);
  goto LAB_0011dd3e;
  while (uVar1 = uVar8 - 1, lVar14 = uVar8 - 1, uVar8 = uVar1, zFile[lVar14] != '/') {
LAB_0011de1d:
    if ((long)uVar8 < 1) {
      uVar15 = 0;
      goto LAB_0011de48;
    }
  }
  uVar15 = (int)uVar1 + 1;
LAB_0011de48:
  iVar6 = sqlite3_strnicmp(zFile + uVar15,"lib",3);
  uVar13 = uVar15 + 3;
  if (iVar6 != 0) {
    uVar13 = uVar15;
  }
  iVar6 = 8;
  for (pbVar12 = (byte *)(zFile + (int)uVar13); (bVar2 = *pbVar12, bVar2 != 0 && (bVar2 != 0x2e));
      pbVar12 = pbVar12 + 1) {
    if ((""[bVar2] & 2) != 0) {
      lVar14 = (long)iVar6;
      iVar6 = iVar6 + 1;
      pcVar9[lVar14] = ""[(uint)(int)(char)bVar2];
    }
  }
  (pcVar9 + (long)iVar6 + 4)[0] = 't';
  (pcVar9 + (long)iVar6 + 4)[1] = '\0';
  builtin_strncpy(pcVar9 + iVar6,"_ini",4);
  p_Var11 = (*psVar3->xDlSym)(psVar3,pvVar10,pcVar9);
  local_50 = pcVar9;
LAB_0011ded6:
  if (pcVar9 != (char *)0x0) {
LAB_0011dedf:
    if (p_Var11 == (_func_void *)0x0) {
      if (local_58 != (char **)0x0) {
        sVar7 = strlen(local_50);
        uVar15 = ((uint)sVar7 & 0x3fffffff) + (int)local_48;
        iVar6 = sqlite3_initialize();
        if (iVar6 == 0) {
          local_60 = (char *)sqlite3Malloc((ulong)uVar15);
        }
        else {
          local_60 = (char *)0x0;
        }
        *local_58 = local_60;
        if (local_60 != (char *)0x0) {
          sqlite3_snprintf(uVar15,local_60,"no entry point [%s] in shared library [%s]",local_50,
                           zFile);
          (*psVar3->xDlError)(psVar3,uVar15 - 1,local_60);
        }
      }
      (*psVar3->xDlClose)(psVar3,pvVar10);
      sqlite3_free(pcVar9);
      uVar15 = 1;
    }
    else {
      sqlite3_free(pcVar9);
      iVar6 = (*p_Var11)(db,&local_60,&sqlite3Apis);
      ppcVar4 = local_58;
      if (iVar6 == 0) {
        n = (long)db->nExtension * 8 + 8;
        __s = (void **)sqlite3DbMallocRawNN(db,n);
        if (__s == (void **)0x0) {
          uVar15 = 7;
        }
        else {
          memset(__s,0,n);
          if (0 < (long)db->nExtension) {
            memcpy(__s,db->aExtension,(long)db->nExtension << 3);
          }
          if (db->aExtension != (void **)0x0) {
            sqlite3DbFreeNN(db,db->aExtension);
          }
          db->aExtension = __s;
          iVar6 = db->nExtension;
          db->nExtension = iVar6 + 1;
          __s[iVar6] = pvVar10;
          uVar15 = 0;
        }
      }
      else {
        uVar15 = 0;
        if (iVar6 != 0x100) {
          if (local_58 != (char **)0x0) {
            pcVar9 = sqlite3_mprintf("error during initialization: %s",local_60);
            *ppcVar4 = pcVar9;
          }
          sqlite3_free(local_60);
          (*psVar3->xDlClose)(psVar3,pvVar10);
          uVar15 = 1;
        }
      }
    }
    goto LAB_0011dd48;
  }
LAB_0011dd3e:
  uVar15 = 7;
LAB_0011dd48:
  if (db->mallocFailed == '\0') {
    uVar15 = uVar15 & db->errMask;
  }
  else {
    apiOomError(db);
    uVar15 = 7;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar15;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}